

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::SetItemOnTaggedNumber
               (Var receiver,RecyclableObject *object,uint32 index,Var newValue,
               ScriptContext *requestContext,PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *function;
  PropertyRecord *local_60;
  PropertyRecord *propertyRecord;
  Var local_50;
  RecyclableObject *local_48;
  RecyclableObject *object_local;
  Var pvStack_38;
  DescriptorFlags flags;
  Var setterValueOrProxy;
  
  local_50 = newValue;
  local_48 = object;
  bVar2 = VarIs<Js::RecyclableObject>(receiver);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xa0d,"(TaggedNumber::Is(receiver))","TaggedNumber::Is(receiver)");
    if (!bVar2) goto LAB_00ab839f;
    *puVar5 = 0;
  }
  if (((requestContext->optimizationOverrides).sideEffects & SideEffects_Accessor) ==
      SideEffects_None) goto LAB_00ab837f;
  pvStack_38 = (Var)0x0;
  object_local._4_4_ = 0;
  if (local_48 == (RecyclableObject *)0x0) {
    GetPropertyObject(receiver,requestContext,&local_48);
  }
  BVar4 = CheckPrototypesForAccessorOrNonWritableItem
                    (local_48,index,&stack0xffffffffffffffc8,
                     (DescriptorFlags *)((long)&object_local + 4),requestContext,0);
  bVar2 = true;
  if (BVar4 != 0) {
    if ((object_local._4_4_ & 1) == 0) {
      if ((object_local._4_4_ & 0x10) == 0) {
        if ((object_local._4_4_ & 6) != 2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0xa30,
                                      "((flags & Data) == Data && (flags & Writable) == None)",
                                      "(flags & Data) == Data && (flags & Writable) == None");
          if (!bVar3) goto LAB_00ab839f;
          *puVar5 = 0;
        }
        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
      }
      else {
        bVar2 = VarIs<Js::JavascriptProxy>(pvStack_38);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0xa28,"(VarIs<JavascriptProxy>(setterValueOrProxy))",
                                      "VarIs<JavascriptProxy>(setterValueOrProxy)");
          if (!bVar2) {
LAB_00ab839f:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
        propertyRecord = (PropertyRecord *)VarTo<Js::JavascriptProxy>(pvStack_38);
        local_60 = (PropertyRecord *)0x0;
        JavascriptProxy::PropertyIdFromInt((JavascriptProxy *)propertyRecord,index,&local_60);
        bVar2 = false;
        index = JavascriptProxy::SetPropertyTrap
                          ((JavascriptProxy *)propertyRecord,receiver,SetItemOnTaggedNumberKind,
                           local_60->pid,local_50,requestContext,propertyOperationFlags,0);
      }
    }
    else {
      bVar3 = JavascriptError::ThrowIfStrictModeUndefinedSetter
                        (propertyOperationFlags,pvStack_38,requestContext);
      index = 1;
      if (!bVar3) {
        if (pvStack_38 == (Var)0x0) goto LAB_00ab837a;
        function = VarTo<Js::RecyclableObject>(pvStack_38);
        CallSetter(function,receiver,local_50,requestContext);
      }
      bVar2 = false;
    }
  }
LAB_00ab837a:
  if (!bVar2) {
    return index;
  }
LAB_00ab837f:
  JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
  return 0;
}

Assistant:

BOOL JavascriptOperators::SetItemOnTaggedNumber(Var receiver, RecyclableObject* object, uint32 index, Var newValue, ScriptContext* requestContext,
        PropertyOperationFlags propertyOperationFlags)
    {
        Assert(TaggedNumber::Is(receiver));

        if (requestContext->optimizationOverrides.GetSideEffects() & SideEffects_Accessor)
        {
            Var setterValueOrProxy = nullptr;
            DescriptorFlags flags = None;
            if (object == nullptr)
            {
                GetPropertyObject(receiver, requestContext, &object);
            }
            if (JavascriptOperators::CheckPrototypesForAccessorOrNonWritableItem(object, index, &setterValueOrProxy, &flags, requestContext))
            {
                if ((flags & Accessor) == Accessor)
                {
                    if (JavascriptError::ThrowIfStrictModeUndefinedSetter(propertyOperationFlags, setterValueOrProxy, requestContext))
                    {
                        return TRUE;
                    }
                    if (setterValueOrProxy)
                    {
                        RecyclableObject* func = VarTo<RecyclableObject>(setterValueOrProxy);
                        JavascriptOperators::CallSetter(func, receiver, newValue, requestContext);
                        return TRUE;
                    }
                }
                else if ((flags & Proxy) == Proxy)
                {
                    Assert(VarIs<JavascriptProxy>(setterValueOrProxy));
                    JavascriptProxy* proxy = VarTo<JavascriptProxy>(setterValueOrProxy);
                    const PropertyRecord* propertyRecord = nullptr;
                    proxy->PropertyIdFromInt(index, &propertyRecord);
                    return proxy->SetPropertyTrap(receiver, JavascriptProxy::SetPropertyTrapKind::SetItemOnTaggedNumberKind, propertyRecord->GetPropertyId(), newValue, requestContext, propertyOperationFlags);
                }
                else
                {
                    Assert((flags & Data) == Data && (flags & Writable) == None);
                    JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
                }
            }
        }

        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
        return FALSE;
    }